

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O2

int I420ToRGB565Dither(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,
                      uint8_t *src_v,int src_stride_v,uint8_t *dst_rgb565,int dst_stride_rgb565,
                      uint8_t *dither4x4,int width,int height)

{
  void *__ptr;
  ulong uVar1;
  uint uVar2;
  uint8_t *puVar3;
  code *pcVar4;
  code *pcVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  code *pcVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  uint8_t *local_70;
  
  auVar11._0_4_ = -(uint)(src_y == (uint8_t *)0x0);
  auVar11._4_4_ = -(uint)(src_u == (uint8_t *)0x0);
  auVar11._8_4_ = -(uint)(src_v == (uint8_t *)0x0);
  auVar11._12_4_ = -(uint)(dst_rgb565 == (uint8_t *)0x0);
  iVar7 = movmskps(src_stride_v,auVar11);
  if ((height == 0 || width < 1) || iVar7 != 0) {
    iVar7 = -1;
  }
  else {
    if (height < 0) {
      uVar2 = -height;
      local_70 = dst_rgb565 + ~height * dst_stride_rgb565;
      dst_stride_rgb565 = -dst_stride_rgb565;
    }
    else {
      local_70 = dst_rgb565;
      uVar2 = height;
    }
    puVar3 = "";
    if (dither4x4 != (uint8_t *)0x0) {
      puVar3 = dither4x4;
    }
    iVar7 = libyuv::TestCpuFlag(0x40);
    bVar10 = (width & 7U) == 0;
    pcVar9 = I422ToARGBRow_Any_SSSE3;
    if (bVar10) {
      pcVar9 = I422ToARGBRow_SSSE3;
    }
    pcVar4 = ARGBToRGB565DitherRow_Any_AVX2;
    if (bVar10) {
      pcVar4 = ARGBToRGB565DitherRow_AVX2;
    }
    if (iVar7 == 0) {
      pcVar9 = I422ToARGBRow_C;
    }
    iVar7 = libyuv::TestCpuFlag(0x400);
    if ((width & 0xfU) == 0) {
      pcVar5 = I422ToARGBRow_AVX2;
    }
    else {
      pcVar5 = I422ToARGBRow_Any_AVX2;
    }
    if (iVar7 == 0) {
      pcVar5 = pcVar9;
    }
    iVar7 = libyuv::TestCpuFlag(0x20);
    if ((width & 3U) == 0) {
      pcVar9 = ARGBToRGB565DitherRow_SSE2;
    }
    else {
      pcVar9 = ARGBToRGB565DitherRow_Any_SSE2;
    }
    if (iVar7 == 0) {
      pcVar9 = ARGBToRGB565DitherRow_C;
    }
    iVar7 = libyuv::TestCpuFlag(0x400);
    if (iVar7 == 0) {
      pcVar4 = pcVar9;
    }
    __ptr = malloc((ulong)(width * 4 + 0x3f));
    uVar1 = (long)__ptr + 0x3fU & 0xffffffffffffffc0;
    uVar8 = 0;
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      (*pcVar5)(src_y,src_u,src_v,uVar1,&kYuvI601Constants,width);
      (*pcVar4)(uVar1,local_70,*(undefined4 *)(puVar3 + (uVar8 & 0xc)),width);
      local_70 = local_70 + dst_stride_rgb565;
      src_y = src_y + src_stride_y;
      src_v = src_v + (int)(-(uVar6 & 1) & src_stride_v);
      src_u = src_u + (int)(-(uVar6 & 1) & src_stride_u);
      uVar8 = uVar8 + 4;
    }
    free(__ptr);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

LIBYUV_API
int I420ToRGB565Dither(const uint8_t* src_y,
                       int src_stride_y,
                       const uint8_t* src_u,
                       int src_stride_u,
                       const uint8_t* src_v,
                       int src_stride_v,
                       uint8_t* dst_rgb565,
                       int dst_stride_rgb565,
                       const uint8_t* dither4x4,
                       int width,
                       int height) {
  int y;
  void (*I422ToARGBRow)(const uint8_t* y_buf, const uint8_t* u_buf,
                        const uint8_t* v_buf, uint8_t* rgb_buf,
                        const struct YuvConstants* yuvconstants, int width) =
      I422ToARGBRow_C;
  void (*ARGBToRGB565DitherRow)(const uint8_t* src_argb, uint8_t* dst_rgb,
                                const uint32_t dither4, int width) =
      ARGBToRGB565DitherRow_C;
  if (!src_y || !src_u || !src_v || !dst_rgb565 || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_rgb565 = dst_rgb565 + (height - 1) * dst_stride_rgb565;
    dst_stride_rgb565 = -dst_stride_rgb565;
  }
  if (!dither4x4) {
    dither4x4 = kDither565_4x4;
  }
#if defined(HAS_I422TOARGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I422ToARGBRow = I422ToARGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGBRow = I422ToARGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_I422TOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I422ToARGBRow = I422ToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I422ToARGBRow = I422ToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_I422TOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    I422ToARGBRow = I422ToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGBRow = I422ToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_I422TOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    I422ToARGBRow = I422ToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      I422ToARGBRow = I422ToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_I422TOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    I422ToARGBRow = I422ToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGBRow = I422ToARGBRow_MSA;
    }
  }
#endif
#if defined(HAS_ARGBTORGB565DITHERROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_Any_SSE2;
    if (IS_ALIGNED(width, 4)) {
      ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_SSE2;
    }
  }
#endif
#if defined(HAS_ARGBTORGB565DITHERROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_Any_AVX2;
    if (IS_ALIGNED(width, 8)) {
      ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBTORGB565DITHERROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBTORGB565DITHERROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBTORGB565DITHERROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_MSA;
    }
  }
#endif
  {
    // Allocate a row of argb.
    align_buffer_64(row_argb, width * 4);
    for (y = 0; y < height; ++y) {
      I422ToARGBRow(src_y, src_u, src_v, row_argb, &kYuvI601Constants, width);
      ARGBToRGB565DitherRow(row_argb, dst_rgb565,
                            *(const uint32_t*)(dither4x4 + ((y & 3) << 2)),
                            width);
      dst_rgb565 += dst_stride_rgb565;
      src_y += src_stride_y;
      if (y & 1) {
        src_u += src_stride_u;
        src_v += src_stride_v;
      }
    }
    free_aligned_buffer_64(row_argb);
  }
  return 0;
}